

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O2

void __thiscall Company::payForService(Company *this)

{
  Employee *this_00;
  bool bVar1;
  int iVar2;
  long lVar3;
  string local_b0;
  Address local_90;
  
  lVar3 = 0;
  while( true ) {
    iVar2 = Boss::getNumberOfEmployees(this->boss);
    if (iVar2 <= lVar3) break;
    Person::getAddress(&local_90,&this->employees[lVar3]->super_Person);
    Address::getCity_abi_cxx11_(&local_b0,&local_90);
    bVar1 = std::operator!=(&local_b0,"Tehran");
    std::__cxx11::string::~string((string *)&local_b0);
    Address::~Address(&local_90);
    if (bVar1) {
      this_00 = this->employees[lVar3];
      iVar2 = Employee::getHourWork(this_00);
      Employee::setHourWork(this_00,iVar2 + 7);
    }
    lVar3 = lVar3 + 1;
  }
  return;
}

Assistant:

void Company::payForService() {
    for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
        if (employees[i]->getAddress().getCity() != "Tehran"){
            employees[i]->setHourWork(employees[i]->getHourWork()+7);
        }
    }
}